

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

void extendFortress(PieceEnv *env,Piece *p,int offh,int offv,int turn,int corridor)

{
  int depth;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Piece *pPVar6;
  int iVar7;
  int y;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  int n;
  ulong uVar14;
  ulong uVar15;
  int local_60;
  
  bVar1 = p->rot;
  uVar13 = 1;
  if (corridor != 0) {
    uVar13 = 7;
  }
  uVar15 = 0xe;
  if (corridor == 0) {
    uVar15 = 7;
  }
  if (turn == -1) {
    iVar7 = (p->bb0).x;
    iVar9 = (p->bb0).z;
    if ((bVar1 & 1) == 0) {
      iVar7 = iVar7 + -1;
      iVar9 = iVar9 + offh;
      local_60 = 3;
    }
    else {
      iVar7 = offh + iVar7;
      iVar9 = iVar9 + -1;
      local_60 = 0;
    }
  }
  else {
    local_60 = 1;
    if (turn == 0) {
      (*(code *)(&DAT_001255a4 + *(int *)(&DAT_001255a4 + (ulong)bVar1 * 4)))();
      return;
    }
    if ((bVar1 & 1) == 0) {
      iVar7 = (p->bb1).x + 1;
      iVar9 = offh + (p->bb0).z;
    }
    else {
      iVar7 = offh + (p->bb0).x;
      iVar9 = (p->bb1).z + 1;
      local_60 = 2;
    }
  }
  depth = p->depth + 1;
  y = offv + (p->bb0).y;
  uVar12 = iVar7 - (env->list->bb0).x;
  uVar8 = -uVar12;
  if (0 < (int)uVar12) {
    uVar8 = uVar12;
  }
  uVar12 = 0xffffffff;
  if (uVar8 < 0x71) {
    uVar10 = iVar9 - (env->list->bb0).z;
    uVar8 = -uVar10;
    if (0 < (int)uVar10) {
      uVar8 = uVar10;
    }
    if (uVar8 < 0x71) {
      piVar11 = &fortress_info[uVar13].max;
      bVar2 = false;
      n = 0;
      for (uVar14 = uVar13; uVar12 = 0, uVar14 < uVar15; uVar14 = uVar14 + 1) {
        bVar3 = bVar2;
        if ((*piVar11 < 1) || (bVar3 = true, env->ntyp[uVar14] < *piVar11)) {
          n = n + piVar11[-1];
          bVar2 = bVar3;
        }
        piVar11 = piVar11 + 0xc;
      }
      if (p->depth < '\x1e' && (0 < n && bVar2)) {
        uVar12 = 0;
        for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
          iVar4 = nextInt(env->rng,n);
          piVar11 = &fortress_info[uVar13].max;
          for (uVar14 = uVar13; uVar14 < uVar15; uVar14 = uVar14 + 1) {
            if (((*piVar11 < 1) || (env->ntyp[uVar14] < *piVar11)) &&
               (iVar4 = iVar4 - piVar11[-1], iVar4 < 0)) {
              if ((uVar14 == (uint)env->typlast) && (piVar11[-2] == 0)) break;
              pPVar6 = addFortressPiece(env,(int)uVar14,iVar7,y,iVar9,depth,local_60,1);
              if (pPVar6 != (Piece *)0x0) {
                return;
              }
            }
            piVar11 = piVar11 + 0xc;
          }
        }
      }
    }
  }
  addFortressPiece(env,0xe,iVar7,y,iVar9,depth,local_60,~uVar12 >> 0x1f);
  return;
}

Assistant:

static
void extendFortress(PieceEnv *env, Piece *p, int offh, int offv, int turn, int corridor)
{
    int x, y, z, t, i;
    int depth = p->depth + 1;
    int facing = p->rot;
    int typ0 = corridor ? CORRIDOR_STRAIGHT : BRIDGE_STRAIGHT;
    int typ1 = typ0 + (corridor ? 7 : 6);
    int valid = -1;
    int weight_tot = 0;

    y = p->bb0.y + offv;

    if (turn == 0) { // forward
        switch (facing) {
        case 0: x = p->bb0.x+offh; z = p->bb0.z-1;    break;
        case 1: x = p->bb1.x+1;    z = p->bb0.z+offh; break;
        case 2: x = p->bb0.x+offh; z = p->bb1.z+1;    break;
        case 3: x = p->bb0.x-1;    z = p->bb0.z+offh; break;
        default: UNREACHABLE();
        }
    } else if (turn == -1) { // left
        if (facing & 1) { x = p->bb0.x+offh; z = p->bb0.z-1;    facing = 0; }
        else            { x = p->bb0.x-1;    z = p->bb0.z+offh; facing = 3; }
    } else if (turn == +1) { // right
        if (facing & 1) { x = p->bb0.x+offh, z = p->bb1.z+1;    facing = 2; }
        else            { x = p->bb1.x+1;    z = p->bb0.z+offh; facing = 1; }
    } else UNREACHABLE();

    if (IABS(x - env->list->bb0.x) > 112 || IABS(z - env->list->bb0.z) > 112)
        goto L_end;

    for (valid = 0, t = typ0; t < typ1; t++)
    {
        int max = fortress_info[t].max;
        if (max > 0 && env->ntyp[t] >= max)
            continue;
        if (max > 0)
            valid = 1;
        weight_tot += fortress_info[t].weight;
    }

    if (valid == 0 || weight_tot <= 0 || depth > 30)
        goto L_end;

    for (i = 0; i < 5; i++)
    {
        int n = nextInt(env->rng, weight_tot);
        for (t = typ0; t < typ1; t++)
        {
            int max = fortress_info[t].max;
            if (max > 0 && env->ntyp[t] >= max)
                continue;
            n -= fortress_info[t].weight;
            if (n >= 0)
                continue;
            if (env->typlast == t && !fortress_info[t].repeatable)
                break;
            if (addFortressPiece(env, t, x, y, z, depth, facing, 1) != NULL)
                return;
        }
    }

L_end:
    addFortressPiece(env, FORTRESS_END, x, y, z, depth, facing, valid >= 0);
}